

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O0

void Js::AsmJSCompiler::VOutputMessage
               (ScriptContext *scriptContext,DEBUG_EVENT_INFO_TYPE messageType,wchar *message,
               __va_list_tag *argptr)

{
  bool bVar1;
  int iVar2;
  char16 *url;
  size_t local_1030;
  size_t size;
  char16 buf [2048];
  __va_list_tag *argptr_local;
  wchar *message_local;
  DEBUG_EVENT_INFO_TYPE messageType_local;
  ScriptContext *scriptContext_local;
  
  buf._4088_8_ = argptr;
  iVar2 = _vsnwprintf_unsafe((WCHAR *)&size,0x800,0xffffffffffffffff,message,argptr);
  local_1030 = (size_t)iVar2;
  if (local_1030 == 0xffffffffffffffff) {
    local_1030 = 0x7ff;
  }
  url = ScriptContext::GetUrl(scriptContext);
  ScriptContext::RaiseMessageToDebugger(scriptContext,messageType,(LPCWSTR)&size,url);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsPhase);
  if ((bVar1) || (bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,AsmjsPhase), bVar1)) {
    Output::PrintBuffer((char16 *)&size,local_1030);
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void AsmJSCompiler::VOutputMessage(ScriptContext * scriptContext, const DEBUG_EVENT_INFO_TYPE messageType, const wchar * message, va_list argptr)
    {
        char16 buf[2048];
        size_t size;

        size = _vsnwprintf_s(buf, _countof(buf), _TRUNCATE, message, argptr);
        if (size == -1)
        {
            size = _countof(buf) - 1;  // characters written, excluding the terminating null
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        scriptContext->RaiseMessageToDebugger(messageType, buf, scriptContext->GetUrl());
#endif
        if (PHASE_TRACE1(AsmjsPhase) || PHASE_TESTTRACE1(AsmjsPhase))
        {
            Output::PrintBuffer(buf, size);
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }